

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

void __thiscall
cmMakefile::cmMakefile
          (cmMakefile *this,cmGlobalGenerator *globalGenerator,cmStateSnapshot *snapshot)

{
  _Rb_tree_header *p_Var1;
  cmStateSnapshot *this_00;
  cmake *pcVar2;
  cmLinkedTree<cmStateDetail::SnapshotDataType> *pcVar3;
  cmState *this_01;
  undefined1 local_78 [16];
  undefined8 local_68;
  undefined8 uStack_60;
  _Base_ptr local_58;
  _Base_ptr local_50;
  _Base_ptr local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  pointer local_38;
  
  (this->FindPackageRootPathStack).
  super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->FindPackageRootPathStack).
  super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (this->FindPackageRootPathStack).
  super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->FindPackageRootPathStack).
  super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->FindPackageRootPathStack).
  super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->FindPackageRootPathStack).
  super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->FindPackageRootPathStack).
  super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->FindPackageRootPathStack).
  super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->FindPackageRootPathStack).
  super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->FindPackageRootPathStack).
  super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::
  _Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::_M_initialize_map((_Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       *)this,0);
  p_Var1 = &(this->CMP0054ReportedIds)._M_t._M_impl.super__Rb_tree_header;
  (this->CMP0054ReportedIds)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->CMP0054ReportedIds)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (this->CMP0054ReportedIds)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->CMP0054ReportedIds)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->CMP0054ReportedIds)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->Targets)._M_h._M_buckets = &(this->Targets)._M_h._M_single_bucket;
  (this->Targets)._M_h._M_bucket_count = 1;
  (this->Targets)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->Targets)._M_h._M_element_count = 0;
  (this->Targets)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->Targets)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->Targets)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  p_Var1 = &(this->AliasTargets)._M_t._M_impl.super__Rb_tree_header;
  (this->AliasTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->AliasTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->AliasTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->AliasTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->AliasTargets)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->SourceFiles).super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->SourceFiles).super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->SourceFiles).super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->SourceFileSearchIndex)._M_h._M_buckets =
       &(this->SourceFileSearchIndex)._M_h._M_single_bucket;
  (this->SourceFileSearchIndex)._M_h._M_bucket_count = 1;
  (this->SourceFileSearchIndex)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->SourceFileSearchIndex)._M_h._M_element_count = 0;
  (this->SourceFileSearchIndex)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->SourceFileSearchIndex)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->SourceFileSearchIndex)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->KnownFileSearchIndex)._M_h._M_buckets = &(this->KnownFileSearchIndex)._M_h._M_single_bucket
  ;
  (this->KnownFileSearchIndex)._M_h._M_bucket_count = 1;
  (this->KnownFileSearchIndex)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->KnownFileSearchIndex)._M_h._M_element_count = 0;
  (this->KnownFileSearchIndex)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->KnownFileSearchIndex)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->KnownFileSearchIndex)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  p_Var1 = &(this->Tests)._M_t._M_impl.super__Rb_tree_header;
  (this->Tests)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->Tests)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->Tests)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->Tests)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->Tests)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->SystemIncludeDirectories)._M_t._M_impl.super__Rb_tree_header;
  (this->SystemIncludeDirectories)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->SystemIncludeDirectories)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->SystemIncludeDirectories)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->SystemIncludeDirectories)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  local_48 = (_Base_ptr)&this->ComplainFileRegularExpression;
  local_38 = (pointer)&(this->ComplainFileRegularExpression).field_2;
  (this->TestGenerators).super__Vector_base<cmTestGenerator_*,_std::allocator<cmTestGenerator_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->TestGenerators).super__Vector_base<cmTestGenerator_*,_std::allocator<cmTestGenerator_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->TestGenerators).super__Vector_base<cmTestGenerator_*,_std::allocator<cmTestGenerator_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->InstallGenerators).
  super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->InstallGenerators).
  super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->OutputFiles).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->InstallGenerators).
  super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->OutputFiles).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->OutputFiles).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ListFiles).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ListFiles).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->SystemIncludeDirectories)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->ListFiles).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ComplainFileRegularExpression)._M_dataplus._M_p = (pointer)local_38;
  (this->ComplainFileRegularExpression)._M_string_length = 0;
  (this->ComplainFileRegularExpression).field_2._M_local_buf[0] = '\0';
  local_50 = (_Base_ptr)&this->DefineFlags;
  local_40 = &(this->DefineFlags).field_2;
  (this->DefineFlags)._M_dataplus._M_p = (pointer)local_40;
  (this->DefineFlags)._M_string_length = 0;
  (this->DefineFlags).field_2._M_local_buf[0] = '\0';
  (this->DefineFlagsOrig)._M_dataplus._M_p = (pointer)&(this->DefineFlagsOrig).field_2;
  (this->DefineFlagsOrig)._M_string_length = 0;
  (this->DefineFlagsOrig).field_2._M_local_buf[0] = '\0';
  (this->SourceGroups).super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->SourceGroups).super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->SourceGroups).super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->FinalPassCommands).super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->FinalPassCommands).super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->FinalPassCommands).super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->GlobalGenerator = globalGenerator;
  (this->StateSnapshot).Position.Position = (snapshot->Position).Position;
  pcVar3 = (snapshot->Position).Tree;
  (this->StateSnapshot).State = snapshot->State;
  (this->StateSnapshot).Position.Tree = pcVar3;
  cmListFileBacktrace::cmListFileBacktrace(&this->Backtrace,snapshot);
  (this->LoopBlockCounter).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->LoopBlockCounter).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (this->LoopBlockCounter).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->LoopBlockCounter).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->LoopBlockCounter).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->LoopBlockCounter).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->LoopBlockCounter).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->LoopBlockCounter).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->LoopBlockCounter).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->LoopBlockCounter).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  (this->FunctionBlockerBarriers).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->FunctionBlockerBarriers).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->FunctionBlockers).
  super__Vector_base<cmFunctionBlocker_*,_std::allocator<cmFunctionBlocker_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->FunctionBlockerBarriers).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->FunctionBlockers).
  super__Vector_base<cmFunctionBlocker_*,_std::allocator<cmFunctionBlocker_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->FunctionBlockers).
  super__Vector_base<cmFunctionBlocker_*,_std::allocator<cmFunctionBlocker_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::_Deque_base<int,_std::allocator<int>_>::_M_initialize_map
            ((_Deque_base<int,_std::allocator<int>_> *)&this->LoopBlockCounter,0);
  (this->cmDefineRegex).regmatch.startp[0] = (char *)0x0;
  (this->cmDefineRegex).regmatch.endp[0] = (char *)0x0;
  (this->cmDefineRegex).regmatch.searchstring = (char *)0x0;
  (this->cmDefineRegex).program = (char *)0x0;
  (this->cmDefine01Regex).regmatch.startp[0] = (char *)0x0;
  (this->cmDefine01Regex).regmatch.endp[0] = (char *)0x0;
  (this->cmDefine01Regex).regmatch.searchstring = (char *)0x0;
  (this->cmDefine01Regex).program = (char *)0x0;
  (this->cmAtVarRegex).regmatch.startp[0] = (char *)0x0;
  (this->cmAtVarRegex).regmatch.endp[0] = (char *)0x0;
  (this->cmAtVarRegex).regmatch.searchstring = (char *)0x0;
  (this->cmAtVarRegex).program = (char *)0x0;
  (this->cmNamedCurly).regmatch.startp[0] = (char *)0x0;
  (this->cmNamedCurly).regmatch.endp[0] = (char *)0x0;
  (this->cmNamedCurly).regmatch.searchstring = (char *)0x0;
  (this->cmNamedCurly).program = (char *)0x0;
  (this->UnConfiguredDirectories).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->UnConfiguredDirectories).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->UnConfiguredDirectories).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ExportBuildFileGenerators).
  super__Vector_base<cmExportBuildFileGenerator_*,_std::allocator<cmExportBuildFileGenerator_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ExportBuildFileGenerators).
  super__Vector_base<cmExportBuildFileGenerator_*,_std::allocator<cmExportBuildFileGenerator_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ExportBuildFileGenerators).
  super__Vector_base<cmExportBuildFileGenerator_*,_std::allocator<cmExportBuildFileGenerator_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->EvaluationFiles).
  super__Vector_base<cmGeneratorExpressionEvaluationFile_*,_std::allocator<cmGeneratorExpressionEvaluationFile_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->EvaluationFiles).
  super__Vector_base<cmGeneratorExpressionEvaluationFile_*,_std::allocator<cmGeneratorExpressionEvaluationFile_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->EvaluationFiles).
  super__Vector_base<cmGeneratorExpressionEvaluationFile_*,_std::allocator<cmGeneratorExpressionEvaluationFile_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ExecutionStatusStack).
  super__Vector_base<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ExecutionStatusStack).
  super__Vector_base<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ExecutionStatusStack).
  super__Vector_base<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ImportedTargetsOwned).super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ImportedTargetsOwned).super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ImportedTargetsOwned).super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ImportedTargets)._M_h._M_buckets = &(this->ImportedTargets)._M_h._M_single_bucket;
  (this->ImportedTargets)._M_h._M_bucket_count = 1;
  (this->ImportedTargets)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->ImportedTargets)._M_h._M_element_count = 0;
  (this->ImportedTargets)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->ImportedTargets)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->ImportedTargets)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->OutputToSource)._M_h._M_buckets = &(this->OutputToSource)._M_h._M_single_bucket;
  (this->OutputToSource)._M_h._M_bucket_count = 1;
  (this->OutputToSource)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->OutputToSource)._M_h._M_element_count = 0;
  (this->OutputToSource)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->OutputToSource)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->OutputToSource)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  p_Var1 = &(this->WarnedCMP0074)._M_t._M_impl.super__Rb_tree_header;
  (this->WarnedCMP0074)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->WarnedCMP0074)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->WarnedCMP0074)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->WarnedCMP0074)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->WarnedCMP0074)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->IsSourceFileTryCompile = false;
  pcVar2 = this->GlobalGenerator->CMakeInstance;
  this->WarnUnused = pcVar2->WarnUnused;
  this->CheckSystemVars = pcVar2->CheckSystemVars;
  this->SuppressSideEffects = false;
  std::__cxx11::string::_M_replace
            ((ulong)local_48,0,(char *)(this->ComplainFileRegularExpression)._M_string_length,
             0x48ffe0);
  std::__cxx11::string::_M_replace
            ((ulong)local_50,0,(char *)(this->DefineFlags)._M_string_length,0x4a7dc9);
  cmsys::RegularExpression::compile
            (&this->cmDefineRegex,"#([ \t]*)cmakedefine[ \t]+([A-Za-z_0-9]*)");
  cmsys::RegularExpression::compile
            (&this->cmDefine01Regex,"#([ \t]*)cmakedefine01[ \t]+([A-Za-z_0-9]*)");
  cmsys::RegularExpression::compile(&this->cmAtVarRegex,"(@[A-Za-z_0-9/.+-]+@)");
  cmsys::RegularExpression::compile(&this->cmNamedCurly,"^[A-Za-z0-9/_.+-]+{");
  this_00 = &this->StateSnapshot;
  this_01 = cmStateSnapshot::GetState(this_00);
  cmState::CreatePolicyScopeSnapshot((cmStateSnapshot *)local_78,this_01,this_00);
  (this->StateSnapshot).Position.Position = local_68;
  this_00->State = (cmState *)local_78._0_8_;
  (this->StateSnapshot).Position.Tree =
       (cmLinkedTree<cmStateDetail::SnapshotDataType> *)local_78._8_8_;
  this->RecursionDepth = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78._0_8_ = (cmState *)0x0;
  local_78._8_8_ = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)0x0;
  local_58 = (_Base_ptr)0x0;
  cmStateSnapshot::PushPolicy(this_00,(PolicyMap *)local_78,false);
  local_78._0_8_ = local_78._0_8_ & 0xffffffff00000000;
  std::deque<int,_std::allocator<int>_>::emplace_back<int>
            (&(this->LoopBlockCounter).c,(int *)local_78);
  this->CheckCMP0000 = false;
  local_78._0_8_ = (cmState *)&stack0xffffffffffffff98;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"");
  AddSourceGroup(this,(string *)local_78,"^.*$");
  if ((cmState *)local_78._0_8_ != (cmState *)&stack0xffffffffffffff98) {
    operator_delete((void *)local_78._0_8_,local_68 + 1);
  }
  local_78._0_8_ = (cmState *)&stack0xffffffffffffff98;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"Source Files","");
  AddSourceGroup(this,(string *)local_78,
                 "\\.(C|M|c|c\\+\\+|cc|cpp|cxx|cu|f|f90|for|fpp|ftn|m|mm|rc|def|r|odl|idl|hpj|bat)$"
                );
  if ((cmState *)local_78._0_8_ != (cmState *)&stack0xffffffffffffff98) {
    operator_delete((void *)local_78._0_8_,local_68 + 1);
  }
  local_78._0_8_ = (cmState *)&stack0xffffffffffffff98;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"Header Files","");
  AddSourceGroup(this,(string *)local_78,"\\.(h|hh|h\\+\\+|hm|hpp|hxx|in|txx|inl)$");
  if ((cmState *)local_78._0_8_ != (cmState *)&stack0xffffffffffffff98) {
    operator_delete((void *)local_78._0_8_,local_68 + 1);
  }
  local_78._0_8_ = (cmState *)&stack0xffffffffffffff98;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"CMake Rules","");
  AddSourceGroup(this,(string *)local_78,"\\.rule$");
  if ((cmState *)local_78._0_8_ != (cmState *)&stack0xffffffffffffff98) {
    operator_delete((void *)local_78._0_8_,local_68 + 1);
  }
  local_78._0_8_ = (cmState *)&stack0xffffffffffffff98;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"Resources","");
  AddSourceGroup(this,(string *)local_78,"\\.(pdf|plist|png|jpeg|jpg|storyboard|xcassets)$");
  if ((cmState *)local_78._0_8_ != (cmState *)&stack0xffffffffffffff98) {
    operator_delete((void *)local_78._0_8_,local_68 + 1);
  }
  local_78._0_8_ = (cmState *)&stack0xffffffffffffff98;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"Object Files","");
  AddSourceGroup(this,(string *)local_78,"\\.(lo|o|obj)$");
  if ((cmState *)local_78._0_8_ != (cmState *)&stack0xffffffffffffff98) {
    operator_delete((void *)local_78._0_8_,local_68 + 1);
  }
  this->ObjectLibrariesSourceGroupIndex =
       ((long)(this->SourceGroups).super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(this->SourceGroups).super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>
              ._M_impl.super__Vector_impl_data._M_start >> 5) * 0x2e8ba2e8ba2e8ba3;
  std::vector<cmSourceGroup,std::allocator<cmSourceGroup>>::
  emplace_back<char_const(&)[17],char_const(&)[19]>
            ((vector<cmSourceGroup,std::allocator<cmSourceGroup>> *)&this->SourceGroups,
             (char (*) [17])"Object Libraries",(char (*) [19])"^MATCH_NO_SOURCES$");
  return;
}

Assistant:

cmMakefile::cmMakefile(cmGlobalGenerator* globalGenerator,
                       cmStateSnapshot const& snapshot)
  : GlobalGenerator(globalGenerator)
  , StateSnapshot(snapshot)
  , Backtrace(snapshot)
{
  this->IsSourceFileTryCompile = false;

  this->WarnUnused = this->GetCMakeInstance()->GetWarnUnused();
  this->CheckSystemVars = this->GetCMakeInstance()->GetCheckSystemVars();

  this->SuppressSideEffects = false;

  // Setup the default include complaint regular expression (match nothing).
  this->ComplainFileRegularExpression = "^$";

  this->DefineFlags = " ";

  this->cmDefineRegex.compile("#([ \t]*)cmakedefine[ \t]+([A-Za-z_0-9]*)");
  this->cmDefine01Regex.compile("#([ \t]*)cmakedefine01[ \t]+([A-Za-z_0-9]*)");
  this->cmAtVarRegex.compile("(@[A-Za-z_0-9/.+-]+@)");
  this->cmNamedCurly.compile("^[A-Za-z0-9/_.+-]+{");

  this->StateSnapshot =
    this->StateSnapshot.GetState()->CreatePolicyScopeSnapshot(
      this->StateSnapshot);
  this->RecursionDepth = 0;

  // Enter a policy level for this directory.
  this->PushPolicy();

  // push empty loop block
  this->PushLoopBlockBarrier();

  // By default the check is not done.  It is enabled by
  // cmListFileCache in the top level if necessary.
  this->CheckCMP0000 = false;

#if defined(CMAKE_BUILD_WITH_CMAKE)
  this->AddSourceGroup("", "^.*$");
  this->AddSourceGroup("Source Files", CM_SOURCE_REGEX);
  this->AddSourceGroup("Header Files", CM_HEADER_REGEX);
  this->AddSourceGroup("CMake Rules", "\\.rule$");
  this->AddSourceGroup("Resources", CM_RESOURCE_REGEX);
  this->AddSourceGroup("Object Files", "\\.(lo|o|obj)$");

  this->ObjectLibrariesSourceGroupIndex = this->SourceGroups.size();
  this->SourceGroups.emplace_back("Object Libraries", "^MATCH_NO_SOURCES$");
#endif
}